

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O2

void Gia_ManPerformOneIter(Gia_ManEra_t *p)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int v;
  long lVar7;
  long lVar8;
  
  v = 1;
  while ((v < p->pAig->nObjs && (pObj = Gia_ManObj(p->pAig,v), pObj != (Gia_Obj_t *)0x0))) {
    iVar3 = (int)*(ulong *)pObj;
    uVar4 = *(ulong *)pObj & 0x1fffffff;
    if (uVar4 == 0x1fffffff || iVar3 < 0) {
      if (iVar3 < 0 && (int)uVar4 != 0x1fffffff) {
        iVar3 = Gia_ObjId(p->pAig,pObj);
        puVar2 = p->pDataSim;
        uVar1 = p->nWordsSim;
        uVar4 = (ulong)uVar1;
        lVar6 = (long)(int)((iVar3 - (*(uint *)pObj & 0x1fffffff)) * uVar1);
        if ((*(uint *)pObj >> 0x1d & 1) == 0) {
          for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
            puVar2[(long)(int)(uVar1 * iVar3) + (uVar4 - 1)] = puVar2[lVar6 + (uVar4 - 1)];
          }
        }
        else {
          for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
            puVar2[(long)(int)(uVar1 * iVar3) + (uVar4 - 1)] = ~puVar2[lVar6 + (uVar4 - 1)];
          }
        }
      }
    }
    else {
      iVar3 = Gia_ObjId(p->pAig,pObj);
      puVar2 = p->pDataSim;
      uVar1 = p->nWordsSim;
      uVar5 = (ulong)uVar1;
      lVar6 = (long)(int)(uVar1 * iVar3);
      uVar4 = *(ulong *)pObj;
      lVar7 = (long)(int)((iVar3 - ((uint)uVar4 & 0x1fffffff)) * uVar1);
      lVar8 = (long)(int)((iVar3 - ((uint)(uVar4 >> 0x20) & 0x1fffffff)) * uVar1);
      if (((uint)uVar4 >> 0x1d & 1) == 0) {
        if ((uVar4 >> 0x3d & 1) == 0) {
          for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
            puVar2[lVar6 + (uVar5 - 1)] = puVar2[lVar8 + (uVar5 - 1)] & puVar2[lVar7 + (uVar5 - 1)];
          }
        }
        else {
          for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
            puVar2[lVar6 + (uVar5 - 1)] = ~puVar2[lVar8 + (uVar5 - 1)] & puVar2[lVar7 + (uVar5 - 1)]
            ;
          }
        }
      }
      else if ((uVar4 >> 0x3d & 1) == 0) {
        for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
          puVar2[lVar6 + (uVar5 - 1)] = ~puVar2[lVar7 + (uVar5 - 1)] & puVar2[lVar8 + (uVar5 - 1)];
        }
      }
      else {
        for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
          puVar2[lVar6 + (uVar5 - 1)] = ~(puVar2[lVar8 + (uVar5 - 1)] | puVar2[lVar7 + (uVar5 - 1)])
          ;
        }
      }
    }
    v = v + 1;
  }
  return;
}

Assistant:

void Gia_ManPerformOneIter( Gia_ManEra_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Gia_ManSimulateNode( p, pObj );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ManSimulateCo( p, pObj );
    }
}